

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_typed_array_slice(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  JSObject *pJVar4;
  uint uVar5;
  JSValue *argv_00;
  ulong uVar6;
  ulong uVar7;
  JSValue this_val_00;
  JSValue this_val_01;
  JSValue this_obj;
  JSValue v;
  JSValue JVar8;
  JSValue prop;
  JSValue val;
  int final;
  JSValueUnion local_a0;
  ulong local_98;
  uint local_90;
  int start;
  int64_t local_88;
  ulong local_80;
  JSObject *local_78;
  ulong local_70;
  JSValue local_68;
  JSValueUnion local_58;
  int64_t local_50;
  ulong local_48;
  undefined8 local_40;
  
  JVar8.tag = this_val.tag;
  iVar2 = js_typed_array_get_length_internal(ctx,this_val);
  if (-1 < iVar2) {
    argv_00 = (JSValue *)0x0;
    local_a0 = this_val.u;
    iVar3 = JS_ToInt32Clamp(ctx,&start,*argv,0,iVar2,iVar2);
    if (iVar3 == 0) {
      final = iVar2;
      if ((int)argv[1].tag != 3) {
        argv_00 = (JSValue *)0x0;
        val.tag = argv[1].tag;
        val.u.ptr = argv[1].u.ptr;
        iVar2 = JS_ToInt32Clamp(ctx,&final,val,0,iVar2,iVar2);
        if (iVar2 != 0) goto LAB_0015c31a;
      }
      local_70 = (ulong)(uint)start;
      uVar5 = final - start;
      uVar6 = 0;
      if (0 < (int)uVar5) {
        uVar6 = (ulong)uVar5;
      }
      JVar8.u.ptr = local_a0.ptr;
      pJVar4 = get_typed_array(ctx,JVar8,0);
      if (pJVar4 != (JSObject *)0x0) {
        local_90 = (uint)(byte)"includes"[(ulong)(pJVar4->field_0).header.dummy2 + 1];
        local_58.float64 = local_a0.float64;
        local_40 = 0;
        this_val_00.tag = (int64_t)&local_58;
        this_val_00.u.float64 = 9.88131291682493e-324;
        local_98 = uVar6;
        local_88 = JVar8.tag;
        local_78 = pJVar4;
        local_50 = JVar8.tag;
        local_48 = uVar6;
        JVar8 = js_typed_array___speciesCreate(ctx,this_val_00,0x167f7a,argv_00);
        uVar7 = (ulong)JVar8.u.ptr >> 0x20;
        if ((int)JVar8.tag != 6) {
          if ((int)uVar5 < 1) {
            return JVar8;
          }
          this_val_01.tag = local_88;
          this_val_01.u.ptr = local_a0.ptr;
          iVar2 = validate_typed_array(ctx,this_val_01);
          if ((iVar2 == 0) && (iVar2 = validate_typed_array(ctx,JVar8), iVar2 == 0)) {
            local_80 = uVar6;
            pJVar4 = get_typed_array(ctx,JVar8,0);
            iVar2 = (int)local_70;
            if ((pJVar4 != (JSObject *)0x0) &&
               (uVar1 = (local_78->field_0).header.dummy2, uVar1 == (pJVar4->field_0).header.dummy2)
               ) {
              if (((uint)local_98 <=
                   ((pJVar4->u).typed_array)->length >> ("includes"[(ulong)uVar1 + 1] & 0x1fU)) &&
                 ((uint)local_98 + iVar2 <=
                  ((local_78->u).typed_array)->length >> ("includes"[(ulong)uVar1 + 1] & 0x1fU))) {
                memcpy((pJVar4->u).func.var_refs,
                       (void *)((long)(iVar2 << ((byte)local_90 & 0x1f)) +
                               (long)(local_78->u).func.var_refs),
                       (long)(int)((uint)local_98 << ((byte)local_90 & 0x1f)));
                return JVar8;
              }
            }
            uVar6 = 0;
            do {
              if (local_80 == uVar6) {
                return JVar8;
              }
              this_obj.tag = local_88;
              this_obj.u.float64 = local_a0.float64;
              local_68 = JS_GetPropertyValue(ctx,this_obj,
                                             (JSValue)ZEXT416((uint)(iVar2 + (int)uVar6)));
              if ((int)local_68.tag == 6) break;
              prop.tag = 0;
              prop.u = (JSValueUnion)uVar6;
              iVar3 = JS_SetPropertyValue(ctx,JVar8,prop,local_68,0x4000);
              uVar6 = uVar6 + 1;
            } while (-1 < iVar3);
          }
        }
        goto LAB_0015c31d;
      }
    }
  }
LAB_0015c31a:
  JVar8 = (JSValue)(ZEXT816(3) << 0x40);
  uVar7 = 0;
LAB_0015c31d:
  v.u.ptr = (void *)((ulong)JVar8.u.ptr & 0xffffffff | uVar7 << 0x20);
  v.tag = JVar8.tag;
  JS_FreeValue(ctx,v);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_typed_array_slice(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValueConst args[2];
    JSValue arr, val;
    JSObject *p, *p1;
    int n, len, start, final, count, shift;

    arr = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    if (JS_ToInt32Clamp(ctx, &start, argv[0], 0, len, len))
        goto exception;
    final = len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &final, argv[1], 0, len, len))
            goto exception;
    }
    count = max_int(final - start, 0);

    p = get_typed_array(ctx, this_val, 0);
    if (p == NULL)
        goto exception;
    shift = typed_array_size_log2(p->class_id);

    args[0] = this_val;
    args[1] = JS_NewInt32(ctx, count);
    arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
    if (JS_IsException(arr))
        goto exception;

    if (count > 0) {
        if (validate_typed_array(ctx, this_val)
        ||  validate_typed_array(ctx, arr))
            goto exception;

        p1 = get_typed_array(ctx, arr, 0);
        if (p1 != NULL && p->class_id == p1->class_id &&
            typed_array_get_length(ctx, p1) >= count &&
            typed_array_get_length(ctx, p) >= start + count) {
            memcpy(p1->u.array.u.uint8_ptr,
                   p->u.array.u.uint8_ptr + (start << shift),
                   count << shift);
        } else {
            for (n = 0; n < count; n++) {
                val = JS_GetPropertyValue(ctx, this_val, JS_NewInt32(ctx, start + n));
                if (JS_IsException(val))
                    goto exception;
                if (JS_SetPropertyValue(ctx, arr, JS_NewInt32(ctx, n), val,
                                        JS_PROP_THROW) < 0)
                    goto exception;
            }
        }
    }
    return arr;

 exception:
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}